

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void eye(double *mat,int N)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    uVar2 = 0;
    do {
      uVar3 = 0;
      do {
        uVar4 = 0x3ff00000;
        if (uVar2 != uVar3) {
          uVar4 = 0;
        }
        mat[uVar3] = (double)((ulong)uVar4 << 0x20);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      uVar2 = uVar2 + 1;
      mat = mat + uVar1;
    } while (uVar2 != uVar1);
  }
  return;
}

Assistant:

void eye(double *mat,int N) {
	int i,j,t;
	for(i = 0;i < N;++i) {
		for(j =0; j < N;++j) {
			t = i*N;
			if (i == j) {
				mat[t+j] = 1.;
			} else {
				mat[t+j] = 0.;
			}
		}
		
	}
}